

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O3

int Gia_ManSeqMarkUsed_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vRoots)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  uint uVar6;
  uint uVar8;
  int iVar9;
  ulong uVar7;
  
  uVar4 = *(ulong *)pObj;
  iVar9 = 0;
  if (((uint)uVar4 >> 0x1e & 1) != 0) {
    iVar9 = 0;
    do {
      *(ulong *)pObj = uVar4 & 0xffffffffbfffffff;
      uVar2 = (uint)uVar4;
      uVar6 = uVar2 & 0x1fffffff;
      uVar7 = (ulong)uVar6;
      if ((-1 < (int)uVar2) || (uVar6 == 0x1fffffff)) {
        if ((~uVar2 & 0x9fffffff) == 0) {
          uVar8 = (uint)(uVar4 >> 0x20) & 0x1fffffff;
          iVar3 = p->vCis->nSize;
          if (iVar3 - p->nRegs <= (int)uVar8) {
            iVar1 = p->vCos->nSize;
            uVar8 = (iVar1 - iVar3) + uVar8;
            if (((int)uVar8 < 0) || (iVar1 <= (int)uVar8)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar3 = p->vCos->pArray[uVar8];
            if ((iVar3 < 0) || (p->nObjs <= iVar3)) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar2 = vRoots->nSize;
            if (uVar2 == vRoots->nCap) {
              if ((int)uVar2 < 0x10) {
                if (vRoots->pArray == (int *)0x0) {
                  piVar5 = (int *)malloc(0x40);
                }
                else {
                  piVar5 = (int *)realloc(vRoots->pArray,0x40);
                }
                vRoots->pArray = piVar5;
                if (piVar5 == (int *)0x0) {
LAB_00714eb7:
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
                vRoots->nCap = 0x10;
              }
              else {
                if (vRoots->pArray == (int *)0x0) {
                  piVar5 = (int *)malloc((ulong)uVar2 * 8);
                }
                else {
                  piVar5 = (int *)realloc(vRoots->pArray,(ulong)uVar2 * 8);
                }
                vRoots->pArray = piVar5;
                if (piVar5 == (int *)0x0) goto LAB_00714eb7;
                vRoots->nCap = uVar2 * 2;
              }
            }
            else {
              piVar5 = vRoots->pArray;
            }
            iVar1 = vRoots->nSize;
            vRoots->nSize = iVar1 + 1;
            piVar5[iVar1] = iVar3;
            return iVar9;
          }
        }
        if (((int)uVar2 < 0) || (uVar6 == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScl.c"
                        ,0x8c,"int Gia_ManSeqMarkUsed_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        iVar3 = Gia_ManSeqMarkUsed_rec(p,pObj + -uVar7,vRoots);
        uVar7 = (ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
        iVar9 = iVar9 + iVar3 + 1;
      }
      pObj = pObj + -uVar7;
      uVar4 = *(ulong *)pObj;
    } while (((uint)uVar4 >> 0x1e & 1) != 0);
  }
  return iVar9;
}

Assistant:

int Gia_ManSeqMarkUsed_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vRoots )
{
    if ( !pObj->fMark0 )
        return 0;
    pObj->fMark0 = 0;
    if ( Gia_ObjIsCo(pObj) )
        return Gia_ManSeqMarkUsed_rec( p, Gia_ObjFanin0(pObj), vRoots );
    if ( Gia_ObjIsRo(p, pObj) )
    {
        Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
        return 0;
    }
    assert( Gia_ObjIsAnd(pObj) );
    return 1 + Gia_ManSeqMarkUsed_rec( p, Gia_ObjFanin0(pObj), vRoots )
             + Gia_ManSeqMarkUsed_rec( p, Gia_ObjFanin1(pObj), vRoots );
}